

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

int Abc_SclHasDelayInfo(void *pScl)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  SC_Cell *pSVar4;
  uint uVar5;
  
  uVar5 = 0;
  pSVar4 = Abc_SclFindInvertor((SC_Lib *)pScl,0);
  if (pSVar4 != (SC_Cell *)0x0) {
    iVar1 = pSVar4->n_inputs;
    if ((long)iVar1 < 1) {
      __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                    ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
    }
    if ((pSVar4->vPins).nSize <= iVar1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar2 = (pSVar4->vPins).pArray[iVar1];
    if (*(int *)((long)pvVar2 + 0x44) != iVar1) {
      __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                    ,0x292,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
    }
    lVar3 = **(long **)((long)pvVar2 + 0x48);
    uVar5 = *(uint *)(lVar3 + 0xc);
    if (uVar5 != 0) {
      if (uVar5 != 1) {
        __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                      ,0x296,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
      }
      uVar5 = (uint)(**(long **)(lVar3 + 0x10) != 0);
    }
  }
  return uVar5;
}

Assistant:

int Abc_SclHasDelayInfo( void * pScl )
{
    SC_Lib * p = (SC_Lib *)pScl;
    SC_Cell * pCell;
    SC_Timing * pTime;
    pCell = Abc_SclFindInvertor(p, 0);
    if ( pCell == NULL )
        return 0;
    pTime = Scl_CellPinTime( pCell, 0 );
    if ( pTime == NULL )
        return 0;
    return 1;
}